

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

char * __thiscall snappy::SnappySinkAllocator::Allocate(SnappySinkAllocator *this,int size)

{
  char *p;
  ulong uVar1;
  undefined1 local_28 [8];
  Datablock block;
  int size_local;
  SnappySinkAllocator *this_local;
  
  uVar1 = (ulong)size;
  if ((long)uVar1 < 0) {
    uVar1 = 0xffffffffffffffff;
  }
  block.size._4_4_ = size;
  p = (char *)operator_new__(uVar1);
  Datablock::Datablock((Datablock *)local_28,p,(long)block.size._4_4_);
  std::
  vector<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
  ::push_back(&this->blocks_,(value_type *)local_28);
  return (char *)local_28;
}

Assistant:

char* Allocate(int size) {
    Datablock block(new char[size], size);
    blocks_.push_back(block);
    return block.data;
  }